

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

void __thiscall cmMakefile::RemoveDefinition(cmMakefile *this,string *name)

{
  cmake *pcVar1;
  cmVariableWatch *this_00;
  
  cmStateSnapshot::RemoveDefinition(&this->StateSnapshot,name);
  pcVar1 = this->GlobalGenerator->CMakeInstance;
  if ((pcVar1 != (cmake *)0x0) &&
     (this_00 = (pcVar1->VariableWatch)._M_t.
                super___uniq_ptr_impl<cmVariableWatch,_std::default_delete<cmVariableWatch>_>._M_t.
                super__Tuple_impl<0UL,_cmVariableWatch_*,_std::default_delete<cmVariableWatch>_>.
                super__Head_base<0UL,_cmVariableWatch_*,_false>._M_head_impl,
     this_00 != (cmVariableWatch *)0x0)) {
    cmVariableWatch::VariableAccessed(this_00,name,4,(char *)0x0,this);
    return;
  }
  return;
}

Assistant:

void cmMakefile::RemoveDefinition(const std::string& name)
{
  this->StateSnapshot.RemoveDefinition(name);
#ifndef CMAKE_BOOTSTRAP
  cmVariableWatch* vv = this->GetVariableWatch();
  if (vv) {
    vv->VariableAccessed(name, cmVariableWatch::VARIABLE_REMOVED_ACCESS,
                         nullptr, this);
  }
#endif
}